

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          string_view fileSetType,string_view description,bool clear)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmFileSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined1 local_120 [48];
  string_view fileSetType_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  fileSetType_local._M_str = fileSetType._M_str;
  fileSetType_local._M_len = fileSetType._M_len;
  this_00 = cmTarget::GetFileSet(self,fileSetName);
  if (this_00 == (cmFileSet *)0x0) {
    pcVar1 = this->Makefile;
    local_60.View_._M_len = description._M_len;
    local_60.View_._M_str = description._M_str;
    local_90.View_._M_len = 0x19;
    local_90.View_._M_str = "has not yet been created.";
    cmStrCat<>((string *)(local_120 + 0x10),&local_60,&local_90);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_120 + 0x10));
  }
  else {
    __x._M_str = (this_00->Type)._M_dataplus._M_p;
    __x._M_len = (this_00->Type)._M_string_length;
    bVar2 = std::operator!=(__x,fileSetType);
    if (!bVar2) {
      if (clear) {
        cmFileSet::ClearDirectoryEntries(this_00);
      }
      if (value->_M_string_length == 0) {
        return;
      }
      std::__cxx11::string::string((string *)&local_e0,(string *)value);
      cmMakefile::GetBacktrace((cmMakefile *)local_120);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_c0,&local_e0,(cmListFileBacktrace *)local_120);
      cmFileSet::AddDirectoryEntry(this_00,&local_c0);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
      this_01 = &local_e0;
      goto LAB_001ce189;
    }
    pcVar1 = this->Makefile;
    local_60.View_._M_len = 10;
    local_60.View_._M_str = "File set \"";
    local_90.View_._M_str = (fileSetName->_M_dataplus)._M_p;
    local_90.View_._M_len = fileSetName->_M_string_length;
    cmStrCat<char[19],std::basic_string_view<char,std::char_traits<char>>,char[3]>
              ((string *)(local_120 + 0x10),&local_60,&local_90,
               (char (*) [19])"\" is not of type \"",&fileSetType_local,(char (*) [3])0x67b310);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_120 + 0x10));
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x10);
LAB_001ce189:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void cmTargetInternals::AddDirectoryToFileSet(
  cmTarget* self, std::string const& fileSetName, ValueType value,
  cm::string_view fileSetType, cm::string_view description, bool clear)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (clear) {
    fileSet->ClearDirectoryEntries();
  }
  if (!StringIsEmpty(value)) {
    fileSet->AddDirectoryEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}